

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O0

int ecp_group_load(mbedtls_ecp_group *grp,mbedtls_mpi_uint *p,size_t plen,mbedtls_mpi_uint *a,
                  size_t alen,mbedtls_mpi_uint *b,size_t blen,mbedtls_mpi_uint *gx,size_t gxlen,
                  mbedtls_mpi_uint *gy,size_t gylen,mbedtls_mpi_uint *n,size_t nlen,
                  mbedtls_ecp_point *T)

{
  size_t sVar1;
  mbedtls_mpi_uint *b_local;
  size_t alen_local;
  mbedtls_mpi_uint *a_local;
  size_t plen_local;
  mbedtls_mpi_uint *p_local;
  mbedtls_ecp_group *grp_local;
  
  ecp_mpi_load(&grp->P,p,plen);
  if (a != (mbedtls_mpi_uint *)0x0) {
    ecp_mpi_load(&grp->A,a,alen);
  }
  ecp_mpi_load(&grp->B,b,blen);
  ecp_mpi_load(&grp->N,n,nlen);
  ecp_mpi_load(&(grp->G).X,gx,gxlen);
  ecp_mpi_load(&(grp->G).Y,gy,gylen);
  ecp_mpi_set1(&(grp->G).Z);
  sVar1 = mbedtls_mpi_bitlen(&grp->P);
  grp->pbits = sVar1;
  sVar1 = mbedtls_mpi_bitlen(&grp->N);
  grp->nbits = sVar1;
  grp->h = 1;
  grp->T = T;
  grp->T_size = 0;
  return 0;
}

Assistant:

static int ecp_group_load(mbedtls_ecp_group *grp,
                          const mbedtls_mpi_uint *p,  size_t plen,
                          const mbedtls_mpi_uint *a,  size_t alen,
                          const mbedtls_mpi_uint *b,  size_t blen,
                          const mbedtls_mpi_uint *gx, size_t gxlen,
                          const mbedtls_mpi_uint *gy, size_t gylen,
                          const mbedtls_mpi_uint *n,  size_t nlen,
                          const mbedtls_ecp_point *T)
{
    ecp_mpi_load(&grp->P, p, plen);
    if (a != NULL) {
        ecp_mpi_load(&grp->A, a, alen);
    }
    ecp_mpi_load(&grp->B, b, blen);
    ecp_mpi_load(&grp->N, n, nlen);

    ecp_mpi_load(&grp->G.X, gx, gxlen);
    ecp_mpi_load(&grp->G.Y, gy, gylen);
    ecp_mpi_set1(&grp->G.Z);

    grp->pbits = mbedtls_mpi_bitlen(&grp->P);
    grp->nbits = mbedtls_mpi_bitlen(&grp->N);

    grp->h = 1;

    grp->T = (mbedtls_ecp_point *) T;
    /*
     * Set T_size to 0 to prevent T free by mbedtls_ecp_group_free.
     */
    grp->T_size = 0;

    return 0;
}